

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_parameter_validation.cpp
# Opt level: O3

ze_result_t __thiscall
validation_layer::ZEParameterValidation::zeEventPoolCreatePrologue
          (ZEParameterValidation *this,ze_context_handle_t hContext,ze_event_pool_desc_t *desc,
          uint32_t numDevices,ze_device_handle_t *phDevices,ze_event_pool_handle_t *phEventPool)

{
  ze_result_t zVar1;
  
  if (hContext == (ze_context_handle_t)0x0) {
    return ZE_RESULT_ERROR_INVALID_NULL_HANDLE;
  }
  zVar1 = ZE_RESULT_ERROR_INVALID_NULL_POINTER;
  if ((((phEventPool != (ze_event_pool_handle_t *)0x0 && desc != (ze_event_pool_desc_t *)0x0) &&
       (zVar1 = ZE_RESULT_ERROR_INVALID_ENUMERATION, desc->flags < 0x10)) &&
      (zVar1 = ZE_RESULT_ERROR_INVALID_SIZE, desc->count != 0)) &&
     (numDevices == 0 || phDevices != (ze_device_handle_t *)0x0)) {
    zVar1 = ParameterValidation::validateExtensions<_ze_event_pool_desc_t_const*>(desc);
    return zVar1;
  }
  return zVar1;
}

Assistant:

ze_result_t
    ZEParameterValidation::zeEventPoolCreatePrologue(
        ze_context_handle_t hContext,                   ///< [in] handle of the context object
        const ze_event_pool_desc_t* desc,               ///< [in] pointer to event pool descriptor
        uint32_t numDevices,                            ///< [in][optional] number of device handles; must be 0 if `nullptr ==
                                                        ///< phDevices`
        ze_device_handle_t* phDevices,                  ///< [in][optional][range(0, numDevices)] array of device handles which
                                                        ///< have visibility to the event pool.
                                                        ///< if nullptr, then event pool is visible to all devices supported by the
                                                        ///< driver instance.
        ze_event_pool_handle_t* phEventPool             ///< [out] pointer handle of event pool object created
        )
    {
        if( nullptr == hContext )
            return ZE_RESULT_ERROR_INVALID_NULL_HANDLE;

        if( nullptr == desc )
            return ZE_RESULT_ERROR_INVALID_NULL_POINTER;

        if( nullptr == phEventPool )
            return ZE_RESULT_ERROR_INVALID_NULL_POINTER;

        if( 0xf < desc->flags )
            return ZE_RESULT_ERROR_INVALID_ENUMERATION;

        if( 0 == desc->count )
            return ZE_RESULT_ERROR_INVALID_SIZE;

        if( (nullptr == phDevices) && (0 < numDevices) )
            return ZE_RESULT_ERROR_INVALID_SIZE;

        return ParameterValidation::validateExtensions(desc);
    }